

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int report(lua_State *L,int status)

{
  char *local_20;
  char *msg;
  int status_local;
  lua_State *L_local;
  
  if (status != 0) {
    local_20 = (char *)lua_tolstring(L,0xffffffff,0);
    if (local_20 == (char *)0x0) {
      local_20 = "(error message not a string)";
    }
    l_message(progname,local_20);
    lua_settop(L,0xfffffffe);
  }
  return status;
}

Assistant:

static int report (lua_State *L, int status) {
  if (status != LUA_OK) {
    const char *msg = lua_tostring(L, -1);
    if (msg == NULL)
      msg = "(error message not a string)";
    l_message(progname, msg);
    lua_pop(L, 1);  /* remove message */
  }
  return status;
}